

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O1

void mtbdd_refs_pushptr(MTBDD *ptr)

{
  long lVar1;
  undefined8 *puVar2;
  void *__ptr;
  void *pvVar3;
  long lVar4;
  long in_FS_OFFSET;
  
  while (lVar1 = *(long *)(in_FS_OFFSET + -0x18), lVar1 == 0) {
    mtbdd_refs_init_key();
  }
  puVar2 = *(undefined8 **)(lVar1 + 0x10);
  *(undefined8 **)(lVar1 + 0x10) = puVar2 + 1;
  *puVar2 = ptr;
  puVar2 = *(undefined8 **)(in_FS_OFFSET + -0x18);
  lVar1 = puVar2[2];
  if (lVar1 == puVar2[1]) {
    __ptr = (void *)*puVar2;
    lVar4 = puVar2[1] - (long)__ptr;
    pvVar3 = realloc(__ptr,lVar4 * 2);
    *puVar2 = pvVar3;
    puVar2[2] = (lVar1 - (long)__ptr) + (long)pvVar3;
    puVar2[1] = (void *)((long)pvVar3 + lVar4 * 2);
  }
  return;
}

Assistant:

void __attribute__((unused))
mtbdd_refs_pushptr(const MTBDD *ptr)
{
    LOCALIZE_THREAD_LOCAL(mtbdd_refs_key, mtbdd_refs_internal_t);
    if (mtbdd_refs_key == 0) {
        mtbdd_refs_init_key();
        mtbdd_refs_pushptr(ptr);
    } else {
        *mtbdd_refs_key->pcur++ = ptr;
        if (mtbdd_refs_key->pcur == mtbdd_refs_key->pend) mtbdd_refs_ptrs_up(mtbdd_refs_key);
    }
}